

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall
slang::ast::Scope::handleUserDefinedNet(Scope *this,UserDefinedNetDeclarationSyntax *syntax)

{
  DeferredMemberIndex DVar1;
  pointer ppNVar2;
  Symbol *netTypeSym;
  long lVar3;
  long lVar4;
  string_view name;
  SourceRange sourceRange;
  LookupLocation location;
  SmallVector<const_slang::ast::NetSymbol_*,_5UL> results;
  SmallVectorBase<const_slang::ast::NetSymbol_*> local_70 [2];
  
  DVar1 = this->deferredMemberIndex;
  this->deferredMemberIndex = Invalid;
  name = parsing::Token::valueText(&syntax->netType);
  sourceRange = parsing::Token::range(&syntax->netType);
  location._12_4_ = 0;
  location.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
  location.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
  netTypeSym = Lookup::unqualifiedAt
                         (this,name,location,sourceRange,(bitmask<slang::ast::LookupFlags>)0x0);
  this->deferredMemberIndex = DVar1;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  NetSymbol::fromSyntax(this,syntax,netTypeSym,local_70);
  ppNVar2 = local_70[0].data_;
  if (local_70[0].len != 0) {
    lVar4 = local_70[0].len << 3;
    lVar3 = 0;
    do {
      addMember(this,*(Symbol **)((long)ppNVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar4 != lVar3);
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    free(local_70[0].data_);
  }
  return;
}

Assistant:

void Scope::handleUserDefinedNet(const UserDefinedNetDeclarationSyntax& syntax) {
    // We aren't elaborated yet so can't do a normal lookup in this scope.
    // Temporarily swap out the deferred member index so that the lookup
    // doesn't trigger elaboration.
    auto savedIndex = std::exchange(deferredMemberIndex, DeferredMemberIndex::Invalid);
    auto symbol = Lookup::unqualifiedAt(*this, syntax.netType.valueText(), LookupLocation::max,
                                        syntax.netType.range());
    deferredMemberIndex = savedIndex;

    SmallVector<const NetSymbol*> results;
    NetSymbol::fromSyntax(*this, syntax, symbol, results);
    for (auto sym : results)
        addMember(*sym);
}